

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.hpp
# Opt level: O2

SPIRConstant * __thiscall
spirv_cross::Parser::set<spirv_cross::SPIRConstant,unsigned_int&>
          (Parser *this,uint32_t id,uint *args)

{
  SPIRConstant *pSVar1;
  
  ParsedIR::add_typed_id(&this->ir,TypeConstant,(ID)id);
  pSVar1 = variant_set<spirv_cross::SPIRConstant,unsigned_int&>
                     ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + id,args);
  (pSVar1->super_IVariant).self.id = id;
  return pSVar1;
}

Assistant:

T &set(uint32_t id, P &&... args)
	{
		ir.add_typed_id(static_cast<Types>(T::type), id);
		auto &var = variant_set<T>(ir.ids[id], std::forward<P>(args)...);
		var.self = id;
		return var;
	}